

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

Status __thiscall leveldb::VersionSet::WriteSnapshot(VersionSet *this,Writer *log)

{
  int iVar1;
  Comparator *pCVar2;
  undefined4 extraout_var;
  ulong uVar3;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *this_00;
  FileMetaData *pFVar4;
  const_reference ppFVar5;
  pointer in_RDX;
  Slice local_160;
  undefined1 local_150 [8];
  string record;
  FileMetaData *f;
  size_t i;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files;
  undefined1 local_110 [4];
  int level_1;
  undefined1 local_100 [8];
  InternalKey key;
  undefined1 local_d8 [4];
  int level;
  undefined1 local_c8 [8];
  VersionEdit edit;
  Writer *log_local;
  VersionSet *this_local;
  
  edit.new_files_.
  super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_RDX;
  VersionEdit::VersionEdit((VersionEdit *)local_c8);
  pCVar2 = InternalKeyComparator::user_comparator((InternalKeyComparator *)(log[1].type_crc_ + 3));
  iVar1 = (*pCVar2->_vptr_Comparator[3])();
  Slice::Slice((Slice *)local_d8,(char *)CONCAT44(extraout_var,iVar1));
  VersionEdit::SetComparatorName((VersionEdit *)local_c8,(Slice *)local_d8);
  for (key.rep_.field_2._12_4_ = 0; (int)key.rep_.field_2._12_4_ < 7;
      key.rep_.field_2._12_4_ = key.rep_.field_2._12_4_ + 1) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      InternalKey::InternalKey((InternalKey *)local_100);
      Slice::Slice((Slice *)local_110,
                   (string *)(log[(long)(int)key.rep_.field_2._12_4_ + 0xb].type_crc_ + 1));
      InternalKey::DecodeFrom((InternalKey *)local_100,(Slice *)local_110);
      VersionEdit::SetCompactPointer
                ((VersionEdit *)local_c8,key.rep_.field_2._12_4_,(InternalKey *)local_100);
      InternalKey::~InternalKey((InternalKey *)local_100);
    }
  }
  for (files._4_4_ = 0; files._4_4_ < 7; files._4_4_ = files._4_4_ + 1) {
    this_00 = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
              (*(long *)&log[0xb].block_offset_ + 0x20 + (long)files._4_4_ * 0x18);
    f = (FileMetaData *)0x0;
    while( true ) {
      pFVar4 = (FileMetaData *)
               std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                         (this_00);
      if (pFVar4 <= f) break;
      ppFVar5 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[](this_00,(size_type)f);
      record.field_2._8_8_ = *ppFVar5;
      VersionEdit::AddFile
                ((VersionEdit *)local_c8,files._4_4_,((value_type)record.field_2._8_8_)->number,
                 ((value_type)record.field_2._8_8_)->file_size,
                 &((value_type)record.field_2._8_8_)->smallest,
                 &((value_type)record.field_2._8_8_)->largest);
      f = (FileMetaData *)((long)&f->refs + 1);
    }
  }
  std::__cxx11::string::string((string *)local_150);
  VersionEdit::EncodeTo((VersionEdit *)local_c8,(string *)local_150);
  Slice::Slice(&local_160,(string *)local_150);
  leveldb::log::Writer::AddRecord
            ((Writer *)this,
             (Slice *)edit.new_files_.
                      super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_150);
  VersionEdit::~VersionEdit((VersionEdit *)local_c8);
  return (Status)(char *)this;
}

Assistant:

Status VersionSet::WriteSnapshot(log::Writer* log) {
  // TODO: Break up into multiple records to reduce memory usage on recovery?

  // Save metadata
  VersionEdit edit;
  edit.SetComparatorName(icmp_.user_comparator()->Name());

  // Save compaction pointers
  for (int level = 0; level < config::kNumLevels; level++) {
    if (!compact_pointer_[level].empty()) {
      InternalKey key;
      key.DecodeFrom(compact_pointer_[level]);
      edit.SetCompactPointer(level, key);
    }
  }

  // Save files
  for (int level = 0; level < config::kNumLevels; level++) {
    const std::vector<FileMetaData*>& files = current_->files_[level];
    for (size_t i = 0; i < files.size(); i++) {
      const FileMetaData* f = files[i];
      edit.AddFile(level, f->number, f->file_size, f->smallest, f->largest);
    }
  }

  std::string record;
  edit.EncodeTo(&record);
  return log->AddRecord(record);
}